

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O0

void * Abc_NodeGetCutsRecursive(void *p,Abc_Obj_t *pObj,int fDag,int fTree)

{
  Abc_Obj_t *pAVar1;
  void *pList;
  int fTree_local;
  int fDag_local;
  Abc_Obj_t *pObj_local;
  void *p_local;
  
  p_local = Abc_NodeReadCuts(p,pObj);
  if (p_local == (void *)0x0) {
    pAVar1 = Abc_ObjFanin0(pObj);
    Abc_NodeGetCutsRecursive(p,pAVar1,fDag,fTree);
    pAVar1 = Abc_ObjFanin1(pObj);
    Abc_NodeGetCutsRecursive(p,pAVar1,fDag,fTree);
    p_local = Abc_NodeGetCuts(p,pObj,fDag,fTree);
  }
  return p_local;
}

Assistant:

void * Abc_NodeGetCutsRecursive( void * p, Abc_Obj_t * pObj, int fDag, int fTree )
{
    void * pList;
    if ( (pList = Abc_NodeReadCuts( p, pObj )) )
        return pList;
    Abc_NodeGetCutsRecursive( p, Abc_ObjFanin0(pObj), fDag, fTree );
    Abc_NodeGetCutsRecursive( p, Abc_ObjFanin1(pObj), fDag, fTree );
    return Abc_NodeGetCuts( p, pObj, fDag, fTree );
}